

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O2

int __thiscall ncnn::ReLU_x86::forward_inplace_int8(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Mat local_78;
  
  iVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  iVar3 = bottom_top_blob->c;
  if (bottom_top_blob->elempack == 8) {
    if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86[-3]) == 0.0) {
      iVar5 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; iVar5 != iVar3; iVar5 = iVar5 + 1) {
        Mat::channel(&local_78,bottom_top_blob,iVar5);
        pvVar1 = local_78.data;
        Mat::~Mat(&local_78);
        for (lVar2 = 0; iVar4 != (int)lVar2; lVar2 = lVar2 + 1) {
          if (*(char *)((long)pvVar1 + lVar2 * 8) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8) = 0;
          }
          if (*(char *)((long)pvVar1 + lVar2 * 8 + 1) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8 + 1) = 0;
          }
          if (*(char *)((long)pvVar1 + lVar2 * 8 + 2) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8 + 2) = 0;
          }
          if (*(char *)((long)pvVar1 + lVar2 * 8 + 3) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8 + 3) = 0;
          }
          if (*(char *)((long)pvVar1 + lVar2 * 8 + 4) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8 + 4) = 0;
          }
          if (*(char *)((long)pvVar1 + lVar2 * 8 + 5) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8 + 5) = 0;
          }
          if (*(char *)((long)pvVar1 + lVar2 * 8 + 6) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8 + 6) = 0;
          }
          if (*(char *)((long)pvVar1 + lVar2 * 8 + 7) < '\0') {
            *(undefined1 *)((long)pvVar1 + lVar2 * 8 + 7) = 0;
          }
        }
      }
    }
  }
  else if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86[-3]) == 0.0) {
    iVar5 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar5 != iVar3; iVar5 = iVar5 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar5);
      pvVar1 = local_78.data;
      Mat::~Mat(&local_78);
      for (lVar2 = 0; iVar4 != (int)lVar2; lVar2 = lVar2 + 1) {
        if (*(char *)((long)pvVar1 + lVar2) < '\0') {
          *(undefined1 *)((long)pvVar1 + lVar2) = 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int ReLU_x86::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
    int elempack = bottom_top_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                signed char* ptr = bottom_top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    if (ptr[0] < 0)
                        ptr[0] = 0;
                    if (ptr[1] < 0)
                        ptr[1] = 0;
                    if (ptr[2] < 0)
                        ptr[2] = 0;
                    if (ptr[3] < 0)
                        ptr[3] = 0;
                    if (ptr[4] < 0)
                        ptr[4] = 0;
                    if (ptr[5] < 0)
                        ptr[5] = 0;
                    if (ptr[6] < 0)
                        ptr[6] = 0;
                    if (ptr[7] < 0)
                        ptr[7] = 0;

                    ptr += 8;
                }
            }
        }
        else
        {
            // TODO leakyrelu
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            int i = 0;
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr = 0;

                ptr++;
            }
        }
    }
    else
    {
        // TODO leakyrelu
    }

    return 0;
}